

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

int Acb_FindArgMaxUnderMask(Vec_Wrd_t *vPats,word *Mask,Vec_Int_t *vWeights,int nPats)

{
  int iVar1;
  word *pwVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int Count;
  
  iVar1 = vPats->nSize / 0x40;
  uVar9 = ((nPats >> 6) + 1) - (uint)((nPats & 0x3fU) == 0);
  uVar12 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar12;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  uVar3 = 0xffffffffffffffff;
  iVar5 = -1;
  while( true ) {
    iVar11 = (int)uVar12;
    if (iVar11 == iVar1) break;
    pwVar2 = Vec_WrdEntryP(vPats,iVar11 << 6);
    iVar4 = 0;
    for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      uVar7 = (Mask[uVar6] & pwVar2[uVar6]) -
              ((Mask[uVar6] & pwVar2[uVar6]) >> 1 & 0x5555555555555555);
      uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
      uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
      uVar7 = (uVar7 >> 8) + uVar7;
      lVar8 = (uVar7 >> 0x10) + uVar7;
      iVar4 = iVar4 + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU);
    }
    uVar3 = uVar3 & 0xffffffff;
    if (iVar5 < iVar4) {
      uVar3 = uVar12;
    }
    if (iVar5 <= iVar4) {
      iVar5 = iVar4;
    }
    uVar12 = (ulong)(iVar11 + 1);
  }
  return (int)uVar3;
}

Assistant:

int Acb_FindArgMaxUnderMask( Vec_Wrd_t * vPats, word Mask[NWORDS], Vec_Int_t * vWeights, int nPats )
{
    int nDivs = Vec_WrdSize(vPats)/NWORDS;
    int nWords = Abc_Bit6WordNum(nPats);
    int i, iBest = -1;
    int Cost, CostBest = -1;
    for ( i = 0; i < nDivs; i++ )
    {
        word * pPat = Vec_WrdEntryP(vPats, NWORDS*i);
        Cost = Abc_TtCountOnesVecMask(Mask, pPat, nWords, 0);
        if ( CostBest < Cost )
//        if ( CostBest == -1 || (float)CostBest/Cost < 0.6*(float)Vec_IntEntry(vWeights, iBest)/Vec_IntEntry(vWeights, i) )
//        if ( CostBest == -1 || (float)CostBest/Cost < 0.67*(float)Vec_IntEntry(vWeights, iBest)/Vec_IntEntry(vWeights, i) )
        {
            CostBest = Cost;
            iBest = i;
        }
    }
    return iBest;
}